

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_assign(CURLM *multi_handle,curl_socket_t s,void *hashp)

{
  CURLMcode CVar1;
  void *pvVar2;
  curl_socket_t local_c;
  
  if (s == -1) {
    pvVar2 = (void *)0x0;
  }
  else {
    local_c = s;
    pvVar2 = Curl_hash_pick((curl_hash *)((long)multi_handle + 0x88),&local_c,4);
  }
  if (pvVar2 == (void *)0x0) {
    CVar1 = CURLM_BAD_SOCKET;
  }
  else {
    *(void **)((long)pvVar2 + 0x10) = hashp;
    CVar1 = CURLM_OK;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_assign(CURLM *multi_handle,
                            curl_socket_t s, void *hashp)
{
  struct Curl_sh_entry *there = NULL;
  struct Curl_multi *multi = (struct Curl_multi *)multi_handle;

  if(s != CURL_SOCKET_BAD)
    there = Curl_hash_pick(&multi->sockhash, (char *)&s,
                           sizeof(curl_socket_t));

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}